

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chatwindow.cpp
# Opt level: O0

void __thiscall ChatWindow::sendMessage(ChatWindow *this)

{
  ChatClient *this_00;
  QStandardItemModel *pQVar1;
  int iVar2;
  Int IVar3;
  Int local_124;
  QVariant local_120 [32];
  QModelIndex local_100;
  undefined1 local_e8 [24];
  QString local_d0;
  QVariant local_b8 [32];
  QModelIndex local_98;
  undefined1 local_80 [24];
  QModelIndex local_68;
  QModelIndex local_50;
  int local_38;
  int newRow;
  QString local_28;
  ChatWindow *local_10;
  ChatWindow *this_local;
  
  this_00 = this->m_chatClient;
  local_10 = this;
  QLineEdit::text();
  ChatClient::sendMessage(this_00,&local_28);
  QString::~QString(&local_28);
  pQVar1 = this->m_chatModel;
  QModelIndex::QModelIndex(&local_50);
  iVar2 = (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1,&local_50);
  pQVar1 = this->m_chatModel;
  local_38 = iVar2;
  QModelIndex::QModelIndex(&local_68);
  QStandardItemModel::insertRow(pQVar1,iVar2,&local_68);
  iVar2 = local_38;
  pQVar1 = this->m_chatModel;
  QModelIndex::QModelIndex(&local_98);
  (**(code **)(*(long *)pQVar1 + 0x60))(local_80,pQVar1,iVar2,0,&local_98);
  QLineEdit::text();
  QVariant::QVariant(local_b8,(QString *)&local_d0);
  (**(code **)(*(long *)pQVar1 + 0x98))(pQVar1,local_80,local_b8,2);
  QVariant::~QVariant(local_b8);
  QString::~QString(&local_d0);
  iVar2 = local_38;
  pQVar1 = this->m_chatModel;
  QModelIndex::QModelIndex(&local_100);
  (**(code **)(*(long *)pQVar1 + 0x60))(local_e8,pQVar1,iVar2,0,&local_100);
  local_124 = (Int)Qt::operator|(AlignRight,AlignVCenter);
  IVar3 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_124);
  QVariant::QVariant(local_120,IVar3);
  (**(code **)(*(long *)pQVar1 + 0x98))(pQVar1,local_e8,local_120,7);
  QVariant::~QVariant(local_120);
  QLineEdit::clear();
  QAbstractItemView::scrollToBottom();
  QString::clear(&this->m_lastUserName);
  return;
}

Assistant:

void ChatWindow::sendMessage()
{
    // we use the client to send the message that the user typed
    m_chatClient->sendMessage(ui->messageEdit->text());
    // now we add the message to the list
    // store the index of the new row to append to the model containing the messages
    const int newRow = m_chatModel->rowCount();
    // insert a row for the message
    m_chatModel->insertRow(newRow);
    // store the message in the model
    m_chatModel->setData(m_chatModel->index(newRow, 0), ui->messageEdit->text());
    // set the alignment for the message
    m_chatModel->setData(m_chatModel->index(newRow, 0), int(Qt::AlignRight | Qt::AlignVCenter), Qt::TextAlignmentRole);
    // clear the content of the message editor
    ui->messageEdit->clear();
    // scroll the view to display the new message
    ui->chatView->scrollToBottom();
    // reset the last printed username
    m_lastUserName.clear();
}